

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall Session::OnMessage(Session *this,Handle *handle,BufferPtr *data,uint32_t param_3)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  uint32_t ret;
  uint32_t len_get;
  char buff [65535];
  uint32_t param_3_local;
  BufferPtr *data_local;
  Handle *handle_local;
  Session *this_local;
  
  this->_messages_read = this->_messages_read + 1;
  peVar3 = std::__shared_ptr_access<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)data);
  uVar1 = (*peVar3->_vptr_Buffer[8])();
  this->_bytes_read = (ulong)uVar1 + this->_bytes_read;
  while( true ) {
    peVar3 = std::__shared_ptr_access<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)data);
    iVar2 = (*peVar3->_vptr_Buffer[8])();
    if (iVar2 == 0) break;
    peVar3 = std::__shared_ptr_access<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)data);
    uVar1 = (*peVar3->_vptr_Buffer[3])(peVar3,&ret,0xffff);
    peVar4 = std::__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)handle);
    (*peVar4->_vptr_CNSocket[5])(peVar4,&ret,(ulong)uVar1);
  }
  return;
}

Assistant:

void OnMessage(cppnet::Handle handle, cppnet::BufferPtr data, uint32_t) {
       char buff[65535];
       ++_messages_read;

       uint32_t len_get = data->GetCanReadLength();
       _bytes_read += len_get;
       while (data->GetCanReadLength()) {
           uint32_t ret = data->Read(buff, 65535);
           handle->Write(buff, ret);
       }
    }